

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

void * tinfl_decompress_mem_to_heap(void *pSrc_buf,size_t src_buf_len,size_t *pOut_len,int flags)

{
  tinfl_status tVar1;
  mz_uint8 *local_2b80;
  ulong uStack_2b60;
  tinfl_status status;
  size_t new_out_buf_capacity;
  size_t dst_buf_size;
  size_t src_buf_size;
  size_t out_buf_capacity;
  size_t src_buf_ofs;
  void *pNew_buf;
  void *pBuf;
  tinfl_decompressor decomp;
  int flags_local;
  size_t *pOut_len_local;
  size_t src_buf_len_local;
  void *pSrc_buf_local;
  
  pNew_buf = (void *)0x0;
  out_buf_capacity = 0;
  src_buf_size = 0;
  *pOut_len = 0;
  pBuf._0_4_ = 0;
  decomp._10996_4_ = flags;
  while( true ) {
    dst_buf_size = src_buf_len - out_buf_capacity;
    new_out_buf_capacity = src_buf_size - *pOut_len;
    if (pNew_buf == (void *)0x0) {
      local_2b80 = (mz_uint8 *)0x0;
    }
    else {
      local_2b80 = (mz_uint8 *)((long)pNew_buf + *pOut_len);
    }
    tVar1 = tinfl_decompress((tinfl_decompressor *)&pBuf,
                             (mz_uint8 *)((long)pSrc_buf + out_buf_capacity),&dst_buf_size,
                             (mz_uint8 *)pNew_buf,local_2b80,&new_out_buf_capacity,
                             decomp._10996_4_ & 0xfffffffd | 4);
    if ((tVar1 < TINFL_STATUS_DONE) || (tVar1 == TINFL_STATUS_NEEDS_MORE_INPUT)) {
      free(pNew_buf);
      *pOut_len = 0;
      return (void *)0x0;
    }
    out_buf_capacity = dst_buf_size + out_buf_capacity;
    *pOut_len = new_out_buf_capacity + *pOut_len;
    if (tVar1 == TINFL_STATUS_DONE) {
      return pNew_buf;
    }
    uStack_2b60 = src_buf_size << 1;
    if (uStack_2b60 < 0x80) {
      uStack_2b60 = 0x80;
    }
    src_buf_ofs = (size_t)realloc(pNew_buf,uStack_2b60);
    if ((void *)src_buf_ofs == (void *)0x0) break;
    src_buf_size = uStack_2b60;
    pNew_buf = (void *)src_buf_ofs;
  }
  free(pNew_buf);
  *pOut_len = 0;
  return (void *)0x0;
}

Assistant:

void *tinfl_decompress_mem_to_heap(const void *pSrc_buf, size_t src_buf_len, size_t *pOut_len, int flags)
{
    tinfl_decompressor decomp;
    void *pBuf = NULL, *pNew_buf;
    size_t src_buf_ofs = 0, out_buf_capacity = 0;
    *pOut_len = 0;
    tinfl_init(&decomp);
    for (;;)
    {
        size_t src_buf_size = src_buf_len - src_buf_ofs, dst_buf_size = out_buf_capacity - *pOut_len, new_out_buf_capacity;
        tinfl_status status = tinfl_decompress(&decomp, (const mz_uint8 *)pSrc_buf + src_buf_ofs, &src_buf_size, (mz_uint8 *)pBuf, pBuf ? (mz_uint8 *)pBuf + *pOut_len : NULL, &dst_buf_size,
                                               (flags & ~TINFL_FLAG_HAS_MORE_INPUT) | TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF);
        if ((status < 0) || (status == TINFL_STATUS_NEEDS_MORE_INPUT))
        {
            MZ_FREE(pBuf);
            *pOut_len = 0;
            return NULL;
        }
        src_buf_ofs += src_buf_size;
        *pOut_len += dst_buf_size;
        if (status == TINFL_STATUS_DONE)
            break;
        new_out_buf_capacity = out_buf_capacity * 2;
        if (new_out_buf_capacity < 128)
            new_out_buf_capacity = 128;
        pNew_buf = MZ_REALLOC(pBuf, new_out_buf_capacity);
        if (!pNew_buf)
        {
            MZ_FREE(pBuf);
            *pOut_len = 0;
            return NULL;
        }
        pBuf = pNew_buf;
        out_buf_capacity = new_out_buf_capacity;
    }
    return pBuf;
}